

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPLL.cpp
# Opt level: O2

int __thiscall Yamaha::OPL::OPLL::snare_drum(OPLL *this)

{
  LogSign LVar1;
  uint uVar2;
  
  LVar1 = WaveformGenerator<9>::snare(&this->oscillator_,this->phase_generators_[0x10].phase_ >> 10)
  ;
  uVar2 = this->rhythm_envelope_generators_[3].tremolo_ + LVar1.log +
          this->rhythm_envelope_generators_[3].attenuation_ * 8 +
          this->channels_[7].attenuation * 0x80;
  return LVar1.sign *
         ((int)*(short *)(&DAT_00407c00 + (ulong)(uVar2 & 0xff) * 2) >> ((byte)(uVar2 >> 8) & 0x1f))
  ;
}

Assistant:

int OPLL::snare_drum() {
	// Use modulator 7 and the carrier attenuation level for channel 7.
	LogSign snare = WaveformGenerator<period_precision>::snare(oscillator_, phase_generators_[7 + 9].phase());
	snare += rhythm_envelope_generators_[RhythmIndices::Snare].attenuation();
	snare += ATTENUATION(channels_[7].attenuation);
	return snare.level();
}